

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O3

STRING_HANDLE URL_Decode(STRING_HANDLE input)

{
  char cVar1;
  size_t i;
  char *pcVar2;
  size_t sVar3;
  LOGGER_LOG p_Var4;
  byte *memory;
  STRING_HANDLE pSVar5;
  int iVar6;
  byte *pbVar7;
  byte bVar8;
  size_t sVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  char cVar9;
  
  if (input == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar2 = "URL_Decode:: NULL input";
    iVar6 = 0x142;
    goto LAB_0016c1c0;
  }
  pcVar2 = STRING_c_str(input);
  sVar3 = strlen(pcVar2);
  if (pcVar2 != (char *)0x0) {
    if (sVar3 != 0) {
      lVar17 = 0;
      uVar16 = 0;
      sVar10 = sVar3;
LAB_0016bf9e:
      bVar11 = pcVar2[uVar16];
      uVar14 = (ulong)bVar11;
      lVar13 = 1;
      if (uVar14 < 0x2f) {
        if ((0x670200000001U >> (uVar14 & 0x3f) & 1) == 0) {
          if (uVar14 != 0x25) goto LAB_0016c049;
          if (((2 < sVar10) &&
              ((bVar11 = pcVar2[uVar16 + 1], (byte)(bVar11 - 0x30) < 10 ||
               ((bVar11 - 0x41 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)(bVar11 - 0x41) & 0x3f) & 1) != 0)))))) &&
             (((byte)(pcVar2[uVar16 + 2] - 0x30U) < 10 ||
              ((uVar12 = (byte)pcVar2[uVar16 + 2] - 0x41, uVar12 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar12 & 0x3f) & 1) != 0)))))) {
            lVar13 = 3;
            if ((bVar11 & 0xf8) == 0x30) goto LAB_0016bfb8;
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar15 = "Out of range of characters accepted by this decoder";
              iVar6 = 0x87;
              goto LAB_0016c171;
            }
            goto LAB_0016c17c;
          }
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c17c;
          pcVar15 = "Incomplete or invalid percent encoding";
          iVar6 = 0x82;
          goto LAB_0016c171;
        }
      }
      else {
LAB_0016c049:
        if (((9 < (byte)(bVar11 - 0x30)) && (bVar11 != 0x5f)) &&
           (0x19 < (byte)((bVar11 & 0xdf) + 0xbf))) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c17c;
          pcVar15 = "Unprintable value in encoded string";
          iVar6 = 0x92;
LAB_0016c171:
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/urlencode.c"
                    ,"calculateDecodedStringSize",iVar6,1,pcVar15);
          goto LAB_0016c17c;
        }
      }
LAB_0016bfb8:
      lVar17 = lVar17 + 1;
      if (lVar17 == 0) {
        lVar17 = -1;
      }
      uVar16 = uVar16 + lVar13;
      sVar10 = sVar10 - lVar13;
      if (sVar3 <= uVar16) goto LAB_0016c17c;
      goto LAB_0016bf9e;
    }
    sVar10 = 1;
    goto LAB_0016c1d0;
  }
  p_Var4 = xlogging_get_log_function();
  if (p_Var4 != (LOGGER_LOG)0x0) {
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/urlencode.c"
              ,"calculateDecodedStringSize",0x70,1,"Null encoded string");
  }
  goto LAB_0016c191;
LAB_0016c17c:
  sVar10 = 0xffffffffffffffff;
  if (lVar17 + 1U != 0) {
    sVar10 = lVar17 + 1U;
  }
  if (pcVar2[uVar16] == '\0') {
LAB_0016c1d0:
    memory = (byte *)malloc(sVar10);
    if (memory != (byte *)0x0) {
      uVar16 = 0;
      pbVar7 = memory;
      do {
        bVar11 = pcVar2[uVar16];
        lVar17 = 1;
        if (bVar11 == 0x25) {
          cVar1 = pcVar2[uVar16 + 1];
          bVar8 = cVar1 - 0x30;
          if (9 < bVar8) {
            cVar9 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar9 = cVar1;
            }
            bVar8 = cVar9 - 0x37;
          }
          cVar1 = pcVar2[uVar16 + 2];
          bVar11 = cVar1 - 0x30;
          if (9 < bVar11) {
            cVar9 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar9 = cVar1;
            }
            bVar11 = cVar9 - 0x37;
          }
          bVar11 = bVar8 << 4 | bVar11;
          lVar17 = 3;
        }
        *pbVar7 = bVar11;
        uVar16 = uVar16 + lVar17;
        pbVar7 = pbVar7 + 1;
      } while (uVar16 <= sVar3);
      pSVar5 = STRING_new_with_memory((char *)memory);
      if (pSVar5 == (STRING_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/urlencode.c"
                    ,"URL_Decode",0x15b,1,"URL_Decode:: MALLOC failure on decode");
        }
        free(memory);
        return (STRING_HANDLE)0x0;
      }
      return pSVar5;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar2 = "URL_Decode:: MALLOC failure on decode.";
    iVar6 = 0x152;
    goto LAB_0016c1c0;
  }
LAB_0016c191:
  p_Var4 = xlogging_get_log_function();
  if (p_Var4 == (LOGGER_LOG)0x0) {
    return (STRING_HANDLE)0x0;
  }
  pcVar2 = "URL_Decode:: Invalid input string";
  iVar6 = 0x14d;
LAB_0016c1c0:
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/urlencode.c"
            ,"URL_Decode",iVar6,1,pcVar2);
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE URL_Decode(STRING_HANDLE input)
{
    STRING_HANDLE result;
    if (input == NULL)
    {
        LogError("URL_Decode:: NULL input");
        result = NULL;
    }
    else
    {
        size_t decodedStringSize;
        char* decodedString;
        const char* inputString = STRING_c_str(input);
        size_t inputLen = strlen(inputString);
        if ((decodedStringSize = calculateDecodedStringSize(inputString, inputLen)) == 0)
        {
            LogError("URL_Decode:: Invalid input string");
            result = NULL;
        }
        else if ((decodedString = (char*)malloc(decodedStringSize)) == NULL)
        {
            LogError("URL_Decode:: MALLOC failure on decode.");
            result = NULL;
        }
        else
        {
            createDecodedString(inputString, inputLen, decodedString);
            result = STRING_new_with_memory(decodedString);
            if (result == NULL)
            {
                LogError("URL_Decode:: MALLOC failure on decode");
                free(decodedString);
            }
        }
    }
    return result;
}